

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def.hpp
# Opt level: O0

string * __thiscall
upb::MessageDefPtr::MiniDescriptorEncode_abi_cxx11_
          (string *__return_storage_ptr__,MessageDefPtr *this)

{
  upb_MessageDef *m;
  upb_Arena *a;
  allocator local_45 [13];
  undefined1 local_38 [8];
  upb_StringView md;
  Arena arena;
  MessageDefPtr *this_local;
  
  Arena::Arena((Arena *)&md.size);
  m = this->ptr_;
  a = Arena::ptr((Arena *)&md.size);
  upb_MessageDef_MiniDescriptorEncode(m,a,(upb_StringView *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)local_38,(ulong)md.data,local_45);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  Arena::~Arena((Arena *)&md.size);
  return __return_storage_ptr__;
}

Assistant:

std::string MiniDescriptorEncode() const {
    upb::Arena arena;
    upb_StringView md;
    upb_MessageDef_MiniDescriptorEncode(ptr_, arena.ptr(), &md);
    return std::string(md.data, md.size);
  }